

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O3

FormulaUnit * __thiscall
Kernel::LocalFormulaUnitTransformer::transform(LocalFormulaUnitTransformer *this,FormulaUnit *unit)

{
  Formula *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  FormulaUnit *this_00;
  Inference local_98;
  FormulaClauseTransformation local_68;
  Inference local_58;
  
  pFVar1 = unit->_formula;
  iVar2 = (*(this->super_FormulaUnitTransformer)._vptr_FormulaUnitTransformer[3])(this,pFVar1);
  if (pFVar1 != (Formula *)CONCAT44(extraout_var,iVar2)) {
    this_00 = (FormulaUnit *)::operator_new(0x48,8);
    local_68.rule = this->_rule;
    local_68.premise = &unit->super_Unit;
    Inference::Inference(&local_98,&local_68);
    local_58._ptr2 = local_98._ptr2;
    local_58.th_ancestors = local_98.th_ancestors;
    local_58.all_ancestors = local_98.all_ancestors;
    local_58._splits = local_98._splits;
    local_58._ptr1 = local_98._ptr1;
    local_58._0_8_ = local_98._0_8_;
    local_58._8_4_ = local_98._8_4_;
    local_58._age = local_98._age;
    Unit::Unit((Unit *)this_00,FORMULA,&local_58);
    this_00->_formula = (Formula *)CONCAT44(extraout_var,iVar2);
    this_00->_cachedColor = COLOR_INVALID;
    this_00->_cachedWeight = 0;
    Unit::doUnitTracing((Unit *)this_00);
    unit = this_00;
  }
  return unit;
}

Assistant:

FormulaUnit* LocalFormulaUnitTransformer::transform(FormulaUnit* unit)
{
  Formula* f = unit->formula();
  Formula* newForm = transform(f);
  if(f==newForm) {
    return unit;
  }
  return new FormulaUnit(newForm, FormulaClauseTransformation(_rule, unit));
}